

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktComputeTestsUtil.cpp
# Opt level: O2

void __thiscall
vkt::compute::Image::Image
          (Image *this,DeviceInterface *vk,VkDevice device,Allocator *allocator,
          VkImageCreateInfo *imageCreateInfo,MemoryRequirement memoryRequirement)

{
  Move<vk::Handle<(vk::HandleType)9>_> *this_00;
  Allocation *pAVar1;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data;
  VkResult result;
  undefined1 in_stack_ffffffffffffff68 [12];
  RefBase<vk::Handle<(vk::HandleType)9>_> local_88;
  Move<vk::Handle<(vk::HandleType)9>_> *local_60;
  undefined1 local_58 [24];
  VkAllocationCallbacks *pVStack_40;
  
  (this->m_allocation).super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
  ptr = (Allocation *)0x0;
  this_00 = &this->m_image;
  (this->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal = 0;
  (this->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  (this->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  local_60 = this_00;
  ::vk::createImage((Move<vk::Handle<(vk::HandleType)9>_> *)&local_88,vk,device,imageCreateInfo,
                    (VkAllocationCallbacks *)0x0);
  local_58._16_8_ = local_88.m_data.deleter.m_device;
  pVStack_40 = local_88.m_data.deleter.m_allocator;
  local_58._0_8_ = local_88.m_data.object.m_internal;
  local_58._8_8_ = local_88.m_data.deleter.m_deviceIface;
  local_88.m_data.object.m_internal = 0;
  local_88.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_88.m_data.deleter.m_device = (VkDevice)0x0;
  local_88.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::reset
            (&this_00->super_RefBase<vk::Handle<(vk::HandleType)9>_>);
  (this->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
       (VkDevice)local_58._16_8_;
  (this->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
       pVStack_40;
  (this_00->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.m_internal = local_58._0_8_
  ;
  (this->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)local_58._8_8_;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::~RefBase(&local_88);
  ::vk::getImageMemoryRequirements
            ((VkMemoryRequirements *)local_58,vk,device,
             (VkImage)(this_00->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.
                      m_internal);
  (*allocator->_vptr_Allocator[3])(&local_88,allocator,local_58,(ulong)memoryRequirement.m_flags);
  local_88.m_data.object.m_internal = 0;
  data._12_4_ = memoryRequirement.m_flags;
  data._0_12_ = in_stack_ffffffffffffff68;
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::assignData
            ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)this,data);
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
            ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_88);
  pAVar1 = (this->m_allocation).
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  result = (*vk->_vptr_DeviceInterface[0xd])
                     (vk,device,
                      (this->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                      m_internal,(pAVar1->m_memory).m_internal,pAVar1->m_offset);
  ::vk::checkResult(result,
                    "vk.bindImageMemory(device, *m_image, m_allocation->getMemory(), m_allocation->getOffset())"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/compute/vktComputeTestsUtil.cpp"
                    ,0x36);
  return;
}

Assistant:

Image::Image (const DeviceInterface&	vk,
			  const VkDevice			device,
			  Allocator&				allocator,
			  const VkImageCreateInfo&	imageCreateInfo,
			  const MemoryRequirement	memoryRequirement)
{
	m_image = createImage(vk, device, &imageCreateInfo);
	m_allocation = allocator.allocate(getImageMemoryRequirements(vk, device, *m_image), memoryRequirement);
	VK_CHECK(vk.bindImageMemory(device, *m_image, m_allocation->getMemory(), m_allocation->getOffset()));
}